

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_mp3_init_memory(void *pData,size_t dataSize,ma_decoding_backend_config *pConfig,
                            ma_allocation_callbacks *pAllocationCallbacks,ma_mp3 *pMP3)

{
  ma_dr_mp3 *pMP3_00;
  ma_result mVar1;
  ma_bool32 mVar2;
  
  mVar1 = ma_mp3_init_internal(pConfig,pMP3);
  if (mVar1 == MA_SUCCESS) {
    pMP3_00 = &pMP3->dr;
    memset(pMP3_00,0,0x3ec0);
    mVar1 = MA_INVALID_FILE;
    if (dataSize != 0 && pData != (void *)0x0) {
      (pMP3->dr).memory.pData = (ma_uint8 *)pData;
      (pMP3->dr).memory.dataSize = dataSize;
      (pMP3->dr).memory.currentReadPos = 0;
      mVar2 = ma_dr_mp3_init_internal
                        (pMP3_00,ma_dr_mp3__on_read_memory,ma_dr_mp3__on_seek_memory,pMP3_00,
                         pAllocationCallbacks);
      if (mVar2 != 0) {
        ma_mp3_post_init(pMP3,pConfig,pAllocationCallbacks);
        mVar1 = MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_mp3_init_memory(const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_mp3* pMP3)
{
    ma_result result;

    result = ma_mp3_init_internal(pConfig, pMP3);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_init_memory(&pMP3->dr, pData, dataSize, pAllocationCallbacks);
        if (mp3Result != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_mp3_post_init(pMP3, pConfig, pAllocationCallbacks);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. */
        (void)pData;
        (void)dataSize;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}